

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

connection __thiscall
obs::signal<void_(int)>::connect<A>(signal<void_(int)> *this,offset_in_A_to_subr m,A *t)

{
  slot_type *s;
  A *in_RCX;
  connection cVar1;
  anon_class_24_2_94732062 local_60;
  A *local_48;
  A *t_local;
  offset_in_A_to_subr m_local;
  signal<void_(int)> *local_30;
  signal<void_(int)> *this_local;
  A *local_20;
  
  local_48 = in_RCX;
  t_local = (A *)m;
  m_local = (offset_in_A_to_subr)t;
  local_30 = this;
  this_local = (signal<void_(int)> *)m;
  local_20 = t;
  s = (slot_type *)operator_new(0x28);
  local_60.t = local_48;
  local_60._16_8_ = m_local;
  local_60.m = (offset_in_A_to_subr)t_local;
  slot<void(int)>::
  slot<obs::signal<void(int)>::connect<A>(void(A::*)(int),A*)::_lambda(int)_1_,void>
            ((slot<void(int)> *)s,&local_60);
  cVar1 = add_slot(this,s);
  return cVar1;
}

Assistant:

connection connect(void (Class::*m)(Args...args), Class* t) {
    return add_slot(new slot_type(
                      [=](Args...args) {
                        (t->*m)(std::forward<Args>(args)...);
                      }));
  }